

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O3

void __thiscall nv::BlockDXT5::flip4(BlockDXT5 *this)

{
  uint uVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  anon_union_4_2_a8ed4774_for_BlockDXT1_2 aVar5;
  undefined1 auVar6 [16];
  
  uVar2 = (this->alpha).field_0.u;
  (this->alpha).field_0.u =
       uVar2 >> 0x24 & 0xfff0000 |
       uVar2 >> 0xc & 0xfff0000000 |
       (uVar2 & 0xfff0000000) << 0xc | (uVar2 & 0xfff0000) << 0x24 | uVar2 & 0xffff;
  uVar1 = (this->color).field_2.indices;
  auVar6 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(uVar1 >> 
                                                  0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar1 >> 0x10),uVar1)) >> 0x20),
                                                  uVar1) >> 0x18),(char)(uVar1 >> 8)),
                            (ushort)(byte)uVar1) & 0xffffff00ffffff);
  auVar6 = pshuflw(auVar6,auVar6,0x1b);
  sVar3 = auVar6._0_2_;
  sVar4 = auVar6._2_2_;
  aVar5.row[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar6[2] - (0xff < sVar4);
  aVar5.row[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar6[0] - (0xff < sVar3);
  sVar3 = auVar6._4_2_;
  aVar5.row[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar6[4] - (0xff < sVar3);
  sVar3 = auVar6._6_2_;
  aVar5.row[3] = (0 < sVar3) * (sVar3 < 0x100) * auVar6[6] - (0xff < sVar3);
  (this->color).field_2 = aVar5;
  return;
}

Assistant:

void AlphaBlockDXT5::flip4()
{
	uint64 * b = (uint64 *)this;
	
	// @@ The masks might have to be byte swapped.
	uint64 tmp = (*b & POSH_U64(0x000000000000FFFF));
	tmp |= (*b & POSH_U64(0x000000000FFF0000)) << 36;
	tmp |= (*b & POSH_U64(0x000000FFF0000000)) << 12;
	tmp |= (*b & POSH_U64(0x000FFF0000000000)) >> 12;
	tmp |= (*b & POSH_U64(0xFFF0000000000000)) >> 36;
	
	*b = tmp;
}